

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::SeekHead::Parse(SeekHead *this)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  SeekHead *pSVar3;
  bool bVar4;
  long lVar5;
  Entry *pEVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint local_6c;
  longlong pos;
  longlong size;
  uint local_54;
  VoidElement *local_50;
  Entry *local_48;
  longlong id;
  SeekHead *local_38;
  
  pReader = this->m_pSegment->m_pReader;
  pos = this->m_start;
  lVar9 = this->m_size + pos;
  local_6c = 0;
  uVar8 = 0;
  local_38 = this;
  while (pSVar3 = local_38, pos < lVar9) {
    lVar5 = ParseElementHeader(pReader,&pos,lVar9,&id,&size);
    if (lVar5 < 0) {
      return lVar5;
    }
    if (id == 0xec) {
      local_6c = local_6c + 1;
    }
    else if (id == 0x4dbb) {
      uVar8 = uVar8 + 1;
    }
    pos = pos + size;
    if (lVar9 < pos) {
      return -2;
    }
  }
  if (pos != lVar9) {
    return -2;
  }
  if (0 < (int)uVar8) {
    pEVar6 = (Entry *)operator_new__((ulong)uVar8 << 5,(nothrow_t *)&std::nothrow);
    if (pEVar6 == (Entry *)0x0) {
      pSVar3->m_entries = (Entry *)0x0;
      return -1;
    }
    memset(pEVar6,0,(ulong)uVar8 << 5);
    pSVar3->m_entries = pEVar6;
  }
  if ((int)local_6c < 1) {
    local_50 = pSVar3->m_void_elements;
  }
  else {
    local_50 = (VoidElement *)operator_new__((ulong)local_6c << 4,(nothrow_t *)&std::nothrow);
    pSVar3->m_void_elements = local_50;
    if (local_50 == (VoidElement *)0x0) {
      return -1;
    }
  }
  lVar5 = pSVar3->m_start;
  local_48 = pSVar3->m_entries;
  local_54 = uVar8;
  while (pos = lVar5, lVar5 < lVar9) {
    lVar7 = ParseElementHeader(pReader,&pos,lVar9,&id,&size);
    pEVar6 = local_48;
    lVar2 = size;
    lVar1 = pos;
    if (lVar7 < 0) {
      return lVar7;
    }
    if (id == 0x4dbb && 0 < (int)uVar8) {
      bVar4 = ParseEntry(pReader,pos,size,local_48);
      uVar8 = local_54;
      if (bVar4) {
        pEVar6->element_start = lVar5;
        pEVar6->element_size = (lVar1 - lVar5) + lVar2;
        local_48 = pEVar6 + 1;
      }
    }
    else if (0 < (int)local_6c && id == 0xec) {
      local_50->element_start = lVar5;
      local_50->element_size = (pos - lVar5) + size;
      local_50 = local_50 + 1;
    }
    lVar5 = lVar1 + lVar2;
    if (lVar9 < lVar5) {
      return -2;
    }
  }
  if (lVar5 != lVar9) {
    return -2;
  }
  lVar9 = (long)local_48 - (long)local_38->m_entries >> 5;
  if (lVar9 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63c,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)uVar8 < lVar9) {
    __assert_fail("count_ <= entry_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x63d,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_entry_count = (int)lVar9;
  lVar9 = (long)local_50 - (long)local_38->m_void_elements >> 4;
  if (lVar9 < 0) {
    __assert_fail("count_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x642,"long mkvparser::SeekHead::Parse()");
  }
  if ((int)local_6c < lVar9) {
    __assert_fail("count_ <= void_element_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x643,"long mkvparser::SeekHead::Parse()");
  }
  local_38->m_void_element_count = (int)lVar9;
  return 0;
}

Assistant:

long SeekHead::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  // first count the seek head entries

  int entry_count = 0;
  int void_element_count = 0;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek)
      ++entry_count;
    else if (id == libwebm::kMkvVoid)
      ++void_element_count;

    pos += size;  // consume payload

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (entry_count > 0) {
    m_entries = new (std::nothrow) Entry[entry_count];

    if (m_entries == NULL)
      return -1;
  }

  if (void_element_count > 0) {
    m_void_elements = new (std::nothrow) VoidElement[void_element_count];

    if (m_void_elements == NULL)
      return -1;
  }

  // now parse the entries and void elements

  Entry* pEntry = m_entries;
  VoidElement* pVoidElement = m_void_elements;

  pos = m_start;

  while (pos < stop) {
    const long long idpos = pos;

    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSeek && entry_count > 0) {
      if (ParseEntry(pReader, pos, size, pEntry)) {
        Entry& e = *pEntry++;

        e.element_start = idpos;
        e.element_size = (pos + size) - idpos;
      }
    } else if (id == libwebm::kMkvVoid && void_element_count > 0) {
      VoidElement& e = *pVoidElement++;

      e.element_start = idpos;
      e.element_size = (pos + size) - idpos;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  ptrdiff_t count_ = ptrdiff_t(pEntry - m_entries);
  assert(count_ >= 0);
  assert(count_ <= entry_count);

  m_entry_count = static_cast<int>(count_);

  count_ = ptrdiff_t(pVoidElement - m_void_elements);
  assert(count_ >= 0);
  assert(count_ <= void_element_count);

  m_void_element_count = static_cast<int>(count_);

  return 0;
}